

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::SelfTestData_Sample::InternalSwap
          (SelfTestData_Sample *this,SelfTestData_Sample *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  uint uVar2;
  string *psVar3;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  void *pvVar6;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pvVar6 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    if (((ulong)pvVar6 & 1) != 0) goto LAB_001b394d;
    uVar1 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar1;
  }
  else {
    if (((ulong)pvVar6 & 1) == 0) {
      google::protobuf::internal::InternalMetadata::
      mutable_unknown_fields_slow<std::__cxx11::string>
                (&(other->super_MessageLite)._internal_metadata_);
      pvVar4 = this_00->ptr_;
    }
LAB_001b394d:
    if (((ulong)pvVar4 & 1) == 0) {
      pbVar5 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::swap((string *)pbVar5);
    pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    uVar1 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar1;
    pvVar4 = pvVar6;
    if (((ulong)pvVar6 & 1) != 0) {
      pvVar4 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      uVar2 = 1;
      goto LAB_001b398b;
    }
  }
  uVar2 = 0;
  pvVar6 = pvVar4;
LAB_001b398b:
  if (((undefined8 *)(this->input_).tagged_ptr_.ptr_ !=
       &google::protobuf::internal::fixed_address_empty_string) ||
     ((undefined8 *)(other->input_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string)) {
    psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->input_,pvVar4);
    google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->input_,pvVar4);
    std::__cxx11::string::swap((string *)psVar3);
    pvVar6 = this_00->ptr_;
    uVar2 = (uint)pvVar6 & 1;
  }
  if (uVar2 != 0) {
    pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  if (((undefined8 *)(this->expected_).tagged_ptr_.ptr_ ==
       &google::protobuf::internal::fixed_address_empty_string) &&
     ((undefined8 *)(other->expected_).tagged_ptr_.ptr_ ==
      &google::protobuf::internal::fixed_address_empty_string)) {
    return;
  }
  psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->expected_,pvVar6);
  google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->expected_,pvVar6);
  std::__cxx11::string::swap((string *)psVar3);
  return;
}

Assistant:

void SelfTestData_Sample::InternalSwap(SelfTestData_Sample* other) {
  using std::swap;
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  input_.Swap(&other->input_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  expected_.Swap(&other->expected_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
}